

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP4Writer::Flush(BP4Writer *this,int transportIndex)

{
  int iVar1;
  BP4Writer *in_RDI;
  ScopedTimer __var2137;
  bool in_stack_00000056;
  bool in_stack_00000057;
  Buffer *in_stack_00000058;
  BPBase *in_stack_00000060;
  bool in_stack_000001c7;
  BP4Writer *in_stack_000001c8;
  void *in_stack_ffffffffffffffc8;
  
  if (Flush(int)::__var137 == '\0') {
    iVar1 = __cxa_guard_acquire(&Flush(int)::__var137);
    if (iVar1 != 0) {
      Flush::__var137 = (void *)ps_timer_create_("BP4Writer::Flush");
      in_stack_ffffffffffffffc8 = Flush::__var137;
      __cxa_guard_release(&Flush(int)::__var137);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_RDI,in_stack_ffffffffffffffc8);
  DoFlush(in_RDI,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0),(int)in_stack_ffffffffffffffc8);
  adios2::format::BPBase::ResetBuffer
            (in_stack_00000060,in_stack_00000058,in_stack_00000057,in_stack_00000056);
  if (((byte)((in_RDI->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x239)
             [(long)&(in_RDI->m_BP4Serializer).super_BP4Base._vptr_BP4Base] & 1) != 0) {
    WriteCollectiveMetadataFile(in_stack_000001c8,in_stack_000001c7);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_RDI);
  return;
}

Assistant:

void BP4Writer::Flush(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP4Writer::Flush");
    DoFlush(false, transportIndex);
    m_BP4Serializer.ResetBuffer(m_BP4Serializer.m_Data, false, false);

    if (m_BP4Serializer.m_Parameters.CollectiveMetadata)
    {
        WriteCollectiveMetadataFile();
    }
}